

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::NeuralNetwork::ByteSizeLong(NeuralNetwork *this)

{
  bool bVar1;
  uint uVar2;
  NeuralNetworkMultiArrayShapeMapping NVar3;
  NeuralNetworkImageShapeMapping NVar4;
  int iVar5;
  NeuralNetworkLayer *value;
  size_t sVar6;
  NeuralNetworkPreprocessing *value_00;
  uint local_28;
  int cached_size;
  uint i_1;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  NeuralNetwork *this_local;
  
  uVar2 = layers_size(this);
  _i = (size_t)uVar2;
  for (i_1 = 0; i_1 < uVar2; i_1 = i_1 + 1) {
    value = layers(this,i_1);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkLayer>(value);
    _i = sVar6 + _i;
  }
  uVar2 = preprocessing_size(this);
  _i = uVar2 + _i;
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    value_00 = preprocessing(this,local_28);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkPreprocessing>(value_00);
    _i = sVar6 + _i;
  }
  bVar1 = has_updateparams(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NetworkUpdateParameters>
                      (this->updateparams_);
    _i = sVar6 + 1 + _i;
  }
  NVar3 = arrayinputshapemapping(this);
  if (NVar3 != RANK5_ARRAY_MAPPING) {
    NVar3 = arrayinputshapemapping(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(NVar3);
    _i = sVar6 + 1 + _i;
  }
  NVar4 = imageinputshapemapping(this);
  if (NVar4 != RANK5_IMAGE_MAPPING) {
    NVar4 = imageinputshapemapping(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(NVar4);
    _i = sVar6 + 1 + _i;
  }
  iVar5 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar5;
  return _i;
}

Assistant:

size_t NeuralNetwork::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetwork)
  size_t total_size = 0;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  {
    unsigned int count = this->preprocessing_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->preprocessing(i));
    }
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updateparams_);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->arrayinputshapemapping());
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->imageinputshapemapping());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}